

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

vec3 closest_point_point_obb(vec3 p,vec3 bc,vec3 bx,vec3 by,vec3 bz,float bex,float bey,float bez)

{
  float *pfVar1;
  int i;
  long lVar2;
  float fVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  vec3 vVar11;
  float be [3];
  float local_20;
  undefined8 local_1c;
  float local_14;
  vec3 local_10;
  
  fVar5 = bc.z;
  uVar4 = bc._0_8_;
  pfVar1 = &local_20;
  local_20 = bx.z;
  local_1c = by._0_8_;
  local_14 = by.z;
  local_10.x = bz.x;
  local_10.y = bz.y;
  local_10.z = bz.z;
  be[0] = bex;
  be[1] = bey;
  be[2] = bez;
  fVar3 = p.z - fVar5;
  lVar2 = 0;
  do {
    fVar6 = (float)*(undefined8 *)(pfVar1 + -2);
    fVar8 = (float)((ulong)*(undefined8 *)(pfVar1 + -2) >> 0x20);
    fVar10 = fVar3 * *pfVar1 + (p.x - bc.x) * fVar6 + (p.y - bc.y) * fVar8;
    fVar7 = be[lVar2];
    fVar9 = fVar7;
    if (fVar10 <= fVar7) {
      fVar9 = fVar10;
    }
    fVar10 = -fVar7;
    if (-fVar7 <= fVar9) {
      fVar10 = fVar9;
    }
    fVar5 = fVar5 + fVar10 * *pfVar1;
    fVar7 = fVar6 * fVar10 + (float)uVar4;
    fVar9 = (float)((ulong)uVar4 >> 0x20) + fVar8 * fVar10;
    uVar4 = CONCAT44(fVar9,fVar7);
    lVar2 = lVar2 + 1;
    pfVar1 = pfVar1 + 3;
  } while (lVar2 != 3);
  vVar11.y = fVar9;
  vVar11.x = fVar7;
  vVar11.z = fVar5;
  return vVar11;
}

Assistant:

vec3 closest_point_point_obb(vec3 p, vec3 bc, vec3 bx, vec3 by, vec3 bz, float bex, float bey, float bez) {
    vec3 bu[3] = {bx, by, bz};
    float be[3] = {bex, bey, bez};
    vec3 d = vec3_sub(p, bc);    
    vec3 q = bc;
    for (int i = 0; i < 3; i++) {
        float dist = vec3_dot(d, bu[i]);
        if (dist > be[i]) dist = be[i];
        if (dist < -be[i]) dist = -be[i];
        q = vec3_add(q, vec3_scale(bu[i], dist));
    }
    return q;
}